

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

wchar_t archive_write_mtree_close(archive_write *a)

{
  att_counter_set *top;
  attr_counter **top_00;
  attr_counter **top_01;
  attr_counter **top_02;
  mtree_writer *mtree;
  wchar_t wVar1;
  wchar_t wVar2;
  mtree_entry_conflict *pmVar3;
  attr_counter *paVar4;
  mtree_entry_conflict *me;
  attr_counter **ppaVar5;
  attr_counter *paVar6;
  attr_counter *ac;
  mtree_entry_conflict **ppmVar7;
  mtree_entry_conflict *e;
  
  mtree = (mtree_writer *)a->format_data;
  me = mtree->root;
  if (me != (mtree_entry_conflict *)0x0) {
    top = &mtree->acs;
    top_00 = &(mtree->acs).gid_list;
    top_01 = &(mtree->acs).mode_list;
    top_02 = &(mtree->acs).flags_list;
    do {
      if (mtree->output_global_set != L'\0') {
        attr_counter_set_free(mtree);
        for (pmVar3 = (mtree_entry_conflict *)
                      __archive_rb_tree_iterate(&me->dir_info->rbtree,(archive_rb_node *)0x0,0);
            pmVar3 != (mtree_entry_conflict *)0x0;
            pmVar3 = (mtree_entry_conflict *)
                     __archive_rb_tree_iterate(&me->dir_info->rbtree,&pmVar3->rbnode,1)) {
          wVar2 = mtree->keys;
          if ((wVar2 & 0x300000U) != 0) {
            paVar4 = top->uid_list;
            if (paVar4 == (attr_counter *)0x0) {
              paVar4 = (attr_counter *)malloc(0x20);
              if (paVar4 == (attr_counter *)0x0) {
                top->uid_list = (attr_counter *)0x0;
                goto LAB_00177a96;
              }
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = L'\x01';
              paVar4->m_entry = pmVar3;
              top->uid_list = paVar4;
            }
            else {
              if (paVar4->m_entry->uid == pmVar3->uid) {
                paVar6 = (attr_counter *)0x0;
              }
              else {
                do {
                  paVar6 = paVar4;
                  paVar4 = paVar6->next;
                  if (paVar4 == (attr_counter *)0x0) break;
                } while (paVar4->m_entry->uid != pmVar3->uid);
              }
              wVar1 = attr_counter_inc(&top->uid_list,paVar4,paVar6,pmVar3);
              if (wVar1 < L'\0') goto LAB_00177a96;
            }
          }
          if ((wVar2 & 0x30U) != 0) {
            paVar4 = *top_00;
            if (paVar4 != (attr_counter *)0x0) {
              if (paVar4->m_entry->gid == pmVar3->gid) {
                paVar6 = (attr_counter *)0x0;
              }
              else {
                do {
                  paVar6 = paVar4;
                  paVar4 = paVar6->next;
                  if (paVar4 == (attr_counter *)0x0) break;
                } while (paVar4->m_entry->gid != pmVar3->gid);
              }
              wVar1 = attr_counter_inc(top_00,paVar4,paVar6,pmVar3);
              if (wVar1 < L'\0') goto LAB_00177a96;
              goto LAB_001777a8;
            }
            paVar4 = (attr_counter *)malloc(0x20);
            ppaVar5 = top_00;
            if (paVar4 != (attr_counter *)0x0) {
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = L'\x01';
              paVar4->m_entry = pmVar3;
              *top_00 = paVar4;
              goto LAB_001777a8;
            }
LAB_00177a8d:
            *ppaVar5 = (attr_counter *)0x0;
            goto LAB_00177a96;
          }
LAB_001777a8:
          if (((uint)wVar2 >> 9 & 1) != 0) {
            paVar4 = *top_01;
            if (paVar4 == (attr_counter *)0x0) {
              paVar4 = (attr_counter *)malloc(0x20);
              ppaVar5 = top_01;
              if (paVar4 == (attr_counter *)0x0) goto LAB_00177a8d;
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = L'\x01';
              paVar4->m_entry = pmVar3;
              *top_01 = paVar4;
            }
            else {
              if (paVar4->m_entry->mode == pmVar3->mode) {
                paVar6 = (attr_counter *)0x0;
              }
              else {
                do {
                  paVar6 = paVar4;
                  paVar4 = paVar6->next;
                  if (paVar4 == (attr_counter *)0x0) break;
                } while (paVar4->m_entry->mode != pmVar3->mode);
              }
              wVar1 = attr_counter_inc(top_01,paVar4,paVar6,pmVar3);
              if (wVar1 < L'\0') goto LAB_00177a96;
            }
          }
          if ((wVar2 & 8U) != 0) {
            if (*top_02 == (attr_counter *)0x0) {
              paVar4 = (attr_counter *)malloc(0x20);
              if (paVar4 == (attr_counter *)0x0) {
                *top_02 = (attr_counter *)0x0;
                goto LAB_00177a96;
              }
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = L'\x01';
              paVar4->m_entry = pmVar3;
              *top_02 = paVar4;
            }
            else {
              paVar4 = (attr_counter *)0x0;
              paVar6 = *top_02;
              do {
                if ((paVar6->m_entry->fflags_set == pmVar3->fflags_set) &&
                   (ac = paVar6, paVar6->m_entry->fflags_clear == pmVar3->fflags_clear)) break;
                ac = paVar6->next;
                paVar4 = paVar6;
                paVar6 = ac;
              } while (ac != (attr_counter *)0x0);
              wVar2 = attr_counter_inc(top_02,ac,paVar4,pmVar3);
              if (wVar2 < L'\0') {
LAB_00177a96:
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
                return L'\xffffffe2';
              }
            }
          }
        }
      }
      if ((me->dir_info->virtual == L'\0') || (mtree->classic != L'\0')) {
        wVar2 = write_mtree_entry(a,me);
        if (wVar2 != L'\0') {
          return L'\xffffffe2';
        }
      }
      else if (mtree->output_global_set != L'\0') {
        write_global(mtree);
      }
      mtree->depth = mtree->depth + L'\x01';
      for (pmVar3 = (mtree_entry_conflict *)
                    __archive_rb_tree_iterate(&me->dir_info->rbtree,(archive_rb_node *)0x0,0);
          pmVar3 != (mtree_entry_conflict *)0x0;
          pmVar3 = (mtree_entry_conflict *)
                   __archive_rb_tree_iterate(&me->dir_info->rbtree,&pmVar3->rbnode,1)) {
        if (pmVar3->dir_info == (dir_info *)0x0) {
          wVar2 = write_mtree_entry(a,pmVar3);
          if (wVar2 != L'\0') {
            return L'\xffffffe2';
          }
        }
        else {
          pmVar3->dir_info->chnext = (mtree_entry_conflict *)0x0;
          *(me->dir_info->children).last = pmVar3;
          (me->dir_info->children).last = &pmVar3->dir_info->chnext;
        }
      }
      wVar2 = mtree->depth;
      mtree->depth = wVar2 + L'\xffffffff';
      pmVar3 = (me->dir_info->children).first;
      if (pmVar3 == (mtree_entry_conflict *)0x0) {
        if ((mtree->classic != L'\0') && (wVar2 = write_dot_dot_entry(a,me), wVar2 != L'\0')) {
          return L'\xffffffe2';
        }
        pmVar3 = me->parent;
        if (me != pmVar3) {
          do {
            ppmVar7 = &me->parent;
            me = me->dir_info->chnext;
            if (me != (mtree_entry_conflict *)0x0) break;
            if (mtree->indent != L'\0') {
              mtree->depth = mtree->depth + L'\xffffffff';
            }
            if ((mtree->classic != L'\0') && (wVar2 = write_dot_dot_entry(a,pmVar3), wVar2 != L'\0')
               ) {
              return L'\xffffffe2';
            }
            me = *ppmVar7;
            pmVar3 = me->parent;
          } while (me != pmVar3);
        }
      }
      else {
        me = pmVar3;
        if (mtree->indent != L'\0') {
          mtree->depth = wVar2;
        }
      }
    } while (me != me->parent);
  }
  archive_write_set_bytes_in_last_block(&a->archive,1);
  wVar2 = __archive_write_output(a,(mtree->buf).s,(mtree->buf).length);
  return wVar2;
}

Assistant:

static int
archive_write_mtree_close(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;
	int ret;

	if (mtree->root != NULL) {
		ret = write_mtree_entry_tree(a);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	archive_write_set_bytes_in_last_block(&a->archive, 1);

	return __archive_write_output(a, mtree->buf.s, mtree->buf.length);
}